

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::run(WebServer *this)

{
  ThreadPool *this_00;
  pointer psVar1;
  ostream *poVar2;
  __shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> *__r;
  vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> epollInSocket;
  Task task;
  vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> local_c8;
  _Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)> local_b0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Task local_60;
  
  local_c8.
  super__Vector_base<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,"wait request");
    std::endl<char,std::char_traits<char>>(poVar2);
    handleEvents((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
                 &local_98,this);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::
    _M_move_assign(&local_c8,&local_98);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               &local_98);
    psVar1 = local_c8.
             super__Vector_base<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__r = &(local_c8.
                 super__Vector_base<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>;
        __r != &psVar1->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>; __r = __r + 1) {
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_b0._M_f = (offset_in_WebServer_to_subr)do_request;
      local_b0._8_8_ = 0;
      local_b0._M_bound_args.super__Tuple_impl<0UL,_WebServer_*,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_WebServer_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_WebServer_*,_std::_Placeholder<1>_>)
           (_Tuple_impl<0UL,_WebServer_*,_std::_Placeholder<1>_>)this;
      std::function<void(std::shared_ptr<void>)>::operator=
                ((function<void(std::shared_ptr<void>)> *)local_98._M_pod_data,&local_b0);
      std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_78,__r);
      this_00 = (this->threadPool_).super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      Task::Task(&local_60,(Task *)&local_98);
      ThreadPool::appendTask(this_00,&local_60);
      Task::~Task(&local_60);
      Task::~Task((Task *)&local_98);
    }
    TimerManager::tick(this->timerManager);
  } while( true );
}

Assistant:

void WebServer::run()
{

    std::vector<std::shared_ptr<HttpData>> epollInSocket;

    while (true)
    {
        std::cout << "wait request" << std::endl;

        epollInSocket = handleEvents();
        for (auto &it : epollInSocket)
        {
            Task task;
            task.function = std::bind(&WebServer::do_request, this, std::placeholders::_1);
            task.arg = it;
            threadPool_->appendTask(task);
        }
        /*每次处理完事件后就检查定时器*/
        timerManager->tick();
    }
}